

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mod.c
# Opt level: O2

int BN_nnmod(BIGNUM *r,BIGNUM *m,BIGNUM *d,BN_CTX *ctx)

{
  int iVar1;
  int iVar2;
  code *UNRECOVERED_JUMPTABLE;
  
  iVar2 = 0;
  iVar1 = BN_div((BIGNUM *)0x0,r,m,d,ctx);
  if (iVar1 != 0) {
    if (r->neg != 0) {
      if (d->neg == 0) {
        UNRECOVERED_JUMPTABLE = BN_add;
      }
      else {
        UNRECOVERED_JUMPTABLE = BN_sub;
      }
      iVar2 = (*UNRECOVERED_JUMPTABLE)(r,r,d);
      return iVar2;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int BN_nnmod(BIGNUM *r, const BIGNUM *m, const BIGNUM *d, BN_CTX *ctx)
{
    /*
     * like BN_mod, but returns non-negative remainder (i.e., 0 <= r < |d|
     * always holds)
     */

    if (!(BN_mod(r, m, d, ctx)))
        return 0;
    if (!r->neg)
        return 1;
    /* now   -|d| < r < 0,  so we have to set  r := r + |d| */
    return (d->neg ? BN_sub : BN_add) (r, r, d);
}